

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void NtoS(int n,tmbstr str)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  tmbstr ptVar8;
  tmbchar tStack_29;
  tmbchar buf [40];
  
  buf[0] = (char)n + (char)(n / 10) * -10 + '0';
  if (n + 9U < 0x13) {
    uVar5 = 0;
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      iVar3 = n >> 0x1f;
      iVar2 = n / 10 + iVar3;
      n = iVar2 - iVar3;
      buf[lVar4 + 1] = (char)n + (char)(n / 10) * -10 + '0';
      lVar4 = lVar4 + 1;
    } while (0x12 < (iVar2 - iVar3) + 9U);
    uVar5 = (uint)lVar4;
  }
  if (-1 < (int)uVar5) {
    lVar6 = (ulong)uVar5 + 1;
    ptVar8 = str;
    do {
      *ptVar8 = buf[lVar6 + -1];
      ptVar8 = ptVar8 + 1;
      lVar7 = lVar6 + -1;
      bVar1 = 0 < lVar6;
      lVar6 = lVar7;
    } while (lVar7 != 0 && bVar1);
  }
  str[lVar4 + 1] = '\0';
  return;
}

Assistant:

static void NtoS(int n, tmbstr str)
{
    tmbchar buf[40];
    int i;
    
    for (i = 0;; ++i)
    {
        buf[i] = (tmbchar)( (n % 10) + '0' );
        
        n = n / 10;
        
        if (n == 0)
            break;
    }
    
    n = i;
    
    while (i >= 0)
    {
        str[n-i] = buf[i];
        --i;
    }
    
    str[n+1] = '\0';
}